

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
FactoredDecPOMDPDiscrete::GetReward(FactoredDecPOMDPDiscrete *this,Index sI,Index jaI)

{
  ulong uVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  double dVar2;
  double this_e_r;
  Index e;
  double r;
  uint local_24;
  double local_20;
  double local_8;
  
  if ((*(byte *)(in_RDI + 0xe0) & 1) == 0) {
    local_20 = 0.0;
    local_24 = 0;
    while( true ) {
      uVar1 = (**(code **)(*in_RDI + 0x278))();
      if (uVar1 <= local_24) break;
      dVar2 = (double)(**(code **)(*in_RDI + 0x268))(in_RDI,local_24,in_ESI,in_EDX);
      local_20 = dVar2 + local_20;
      local_24 = local_24 + 1;
    }
    local_8 = local_20;
  }
  else {
    local_8 = (double)(*(code *)**(undefined8 **)in_RDI[0xdf])
                                ((undefined8 *)in_RDI[0xdf],in_ESI,in_EDX);
  }
  return local_8;
}

Assistant:

double FactoredDecPOMDPDiscrete::GetReward(Index sI, Index jaI) const
{
    if(_m_cached_FlatRM)
        return _m_p_rModel->Get(sI,jaI);

    //sum over local reward functions
    double r = 0.0;
    for(Index e=0; e < GetNrLRFs(); e++)
    {
        double this_e_r = GetLRFRewardFlat(e, sI, jaI);
        r += this_e_r;
    }
    return(r);
}